

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int tcache_destroy_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                      size_t newlen)

{
  long in_RCX;
  long in_R8;
  int *in_R9;
  uint tcache_ind;
  int ret;
  int local_38;
  int local_34;
  
  if ((in_RCX == 0) && (in_R8 == 0)) {
    local_38 = -1;
    if (in_R9 != (int *)0x0) {
      if (newp != (void *)0x4) {
        return 0x16;
      }
      local_38 = *in_R9;
    }
    if (local_38 == -1) {
      local_34 = 0xe;
    }
    else {
      tcaches_destroy((tsd_t *)0x0,0);
      local_34 = 0;
    }
  }
  else {
    local_34 = 1;
  }
  return local_34;
}

Assistant:

static int
tcache_destroy_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	WRITEONLY();
	tcache_ind = UINT_MAX;
	WRITE(tcache_ind, unsigned);
	if (tcache_ind == UINT_MAX) {
		ret = EFAULT;
		goto label_return;
	}
	tcaches_destroy(tsd, tcache_ind);

	ret = 0;
label_return:
	return ret;
}